

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzquadratictetra.cpp
# Opt level: O2

void pzgeom::TPZQuadraticTetra::InsertExampleElement
               (TPZGeoMesh *gmesh,int matid,TPZVec<double> *lowercorner,TPZVec<double> *size)

{
  double *pdVar1;
  double *pdVar2;
  int iVar3;
  TPZGeoNode *pTVar4;
  TPZGeoEl *pTVar5;
  long lVar6;
  int i_2;
  int j;
  long lVar7;
  int i_1;
  int iVar8;
  int64_t index;
  double local_158;
  TPZManVector<double,_3> co;
  TPZManVector<double,_3> co_1;
  TPZManVector<double,_3> scale;
  TPZManVector<double,_3> shift;
  TPZManVector<long,_4> nodeindexes;
  
  TPZManVector<double,_3>::TPZManVector(&co,3);
  TPZManVector<double,_3>::TPZManVector(&shift,3);
  TPZManVector<double,_3>::TPZManVector(&scale,3);
  TPZManVector<long,_4>::TPZManVector(&nodeindexes,4);
  pdVar1 = size->fStore;
  pdVar2 = lowercorner->fStore;
  for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
    scale.super_TPZVec<double>.fStore[lVar6] = pdVar1[lVar6] / 3.0;
    shift.super_TPZVec<double>.fStore[lVar6] = pdVar1[lVar6] * 0.5 + pdVar2[lVar6];
  }
  for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
    pztopology::TPZTetrahedron::ParametricDomainNodeCoord((int)lVar6,&co.super_TPZVec<double>);
    co_1.super_TPZVec<double>._vptr_TPZVec = (_func_int **)0x0;
    TPZManVector<double,_3>::Resize(&co,3,(double *)&co_1);
    for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
      local_158 = scale.super_TPZVec<double>.fStore[lVar7] * co.super_TPZVec<double>.fStore[lVar7] +
                  shift.super_TPZVec<double>.fStore[lVar7];
      iVar3 = rand();
      co.super_TPZVec<double>.fStore[lVar7] =
           ((double)iVar3 * 0.2) / 2147483647.0 + local_158 + -0.1;
    }
    iVar3 = TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(&gmesh->fNodeVec);
    nodeindexes.super_TPZVec<long>.fStore[lVar6] = (long)iVar3;
    pTVar4 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                       (&(gmesh->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>,(long)iVar3);
    TPZGeoNode::Initialize(pTVar4,&co.super_TPZVec<double>,gmesh);
  }
  (*(gmesh->super_TPZSavable)._vptr_TPZSavable[0xc])
            (gmesh,4,&nodeindexes,(ulong)(uint)matid,&index,1);
  pTVar5 = TPZGeoMesh::Element(gmesh,index);
  iVar3 = (**(code **)(*(long *)pTVar5 + 0xf0))(pTVar5);
  iVar8 = 0;
  if (iVar3 < 1) {
    iVar3 = iVar8;
  }
  for (; iVar3 != iVar8; iVar8 = iVar8 + 1) {
    (**(code **)(*(long *)pTVar5 + 0x180))(pTVar5,iVar8);
  }
  pTVar5 = TPZChangeEl::ChangeToQuadratic(gmesh,index);
  iVar3 = (**(code **)(*(long *)pTVar5 + 0x98))(pTVar5);
  while( true ) {
    iVar8 = (**(code **)(*(long *)pTVar5 + 0x90))(pTVar5);
    if (iVar8 <= iVar3) break;
    TPZManVector<double,_3>::TPZManVector(&co_1,3);
    pTVar4 = TPZGeoEl::NodePtr(pTVar5,iVar3);
    TPZGeoNode::GetCoordinates(pTVar4,&co_1.super_TPZVec<double>);
    for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
      iVar8 = rand();
      co_1.super_TPZVec<double>.fStore[lVar6] =
           ((double)iVar8 * 0.2) / 2147483647.0 + -0.1 + co_1.super_TPZVec<double>.fStore[lVar6];
    }
    pTVar4 = TPZGeoEl::NodePtr(pTVar5,iVar3);
    TPZGeoNode::SetCoord(pTVar4,&co_1.super_TPZVec<double>);
    TPZManVector<double,_3>::~TPZManVector(&co_1);
    iVar3 = iVar3 + 1;
  }
  TPZManVector<long,_4>::~TPZManVector(&nodeindexes);
  TPZManVector<double,_3>::~TPZManVector(&scale);
  TPZManVector<double,_3>::~TPZManVector(&shift);
  TPZManVector<double,_3>::~TPZManVector(&co);
  return;
}

Assistant:

void TPZQuadraticTetra::InsertExampleElement(TPZGeoMesh &gmesh, int matid, TPZVec<REAL> &lowercorner, TPZVec<REAL> &size)
{
    TPZManVector<REAL,3> co(3),shift(3),scale(3);
    TPZManVector<int64_t,4> nodeindexes(NCornerNodes);
    for (int i=0; i<3; i++) {
        scale[i] = size[i]/3.;
        shift[i] = size[i]/2.+lowercorner[i];
    }
    
    for (int i=0; i<NCornerNodes; i++) {
        ParametricDomainNodeCoord(i, co);
        co.Resize(3,0.);
        for (int j=0; j<3; j++) {
            co[j] = shift[j]+scale[j]*co[j]+(rand()*0.2/RAND_MAX)-0.1;
        }
        nodeindexes[i] = gmesh.NodeVec().AllocateNewElement();
        gmesh.NodeVec()[nodeindexes[i]].Initialize(co, gmesh);
    }
    int64_t index;
    gmesh.CreateGeoElement(ETetraedro, nodeindexes, matid, index);
    TPZGeoEl *gel = gmesh.Element(index);
    int nsides = gel->NSides();
    for (int is=0; is<nsides; is++) {
        gel->SetSideDefined(is);
    }
    gel = TPZChangeEl::ChangeToQuadratic(&gmesh, index);
    for (int node = gel->NCornerNodes(); node < gel->NNodes(); node++) {
        TPZManVector<REAL,3> co(3);
        gel->NodePtr(node)->GetCoordinates(co);
        for (int i=0; i<3; i++) {
            co[i] += (0.2*rand())/RAND_MAX - 0.1;
        }
        gel->NodePtr(node)->SetCoord(co);
    }
}